

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * archive_entry_copy_fflags_text_w(archive_entry *entry,wchar_t *flags)

{
  wchar_t *pwVar1;
  wchar_t *flags_local;
  archive_entry *entry_local;
  
  archive_mstring_copy_wcs(&entry->ae_fflags_text,flags);
  pwVar1 = ae_wcstofflags(flags,&entry->ae_fflags_set,&entry->ae_fflags_clear);
  return pwVar1;
}

Assistant:

const wchar_t *
archive_entry_copy_fflags_text_w(struct archive_entry *entry,
    const wchar_t *flags)
{
	archive_mstring_copy_wcs(&entry->ae_fflags_text, flags);
	return (ae_wcstofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}